

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::TextureBufferCase::iterate(TextureBufferCase *this)

{
  RenderBits renderBits;
  ModifyBits MVar1;
  RenderBits renderBits_00;
  TestContext *testCtx;
  RenderContext *context;
  ShaderProgram *program;
  ShaderProgram *program_00;
  TextureFormat log;
  TextureFormat TVar2;
  TextureFormat TVar3;
  bool bVar4;
  char cVar5;
  int i_1;
  deUint32 dVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ContextType CVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MessageBuilder *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar14;
  long lVar15;
  undefined4 extraout_var_05;
  TestError *pTVar16;
  int height;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  uchar uVar22;
  uchar uVar23;
  long lVar24;
  size_t sVar25;
  undefined8 uVar26;
  float fVar27;
  Random rng;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  ScopedLogSection section;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  size_t local_310;
  _func_int **local_308;
  deUint32 local_2fc;
  deInt32 maxTextureSize;
  size_type sStack_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_3;
  Vec4 local_2a8;
  ScopedLogSection modifySection;
  Surface referenceTarget;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferData;
  ulong local_238;
  ulong local_230;
  deRandom local_228;
  deInt32 alignment;
  ChannelType CStack_214;
  _func_int **app_Stack_210 [47];
  ResultCollector resultCollector;
  deRandom local_48;
  
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar7 = (dVar6 >> 0x10 ^ dVar6 ^ 0x3d) * 9;
  uVar7 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
  deRandom_init(&rng.m_rnd,uVar7 >> 0xf ^ uVar7);
  if (this->m_offset == 0) {
    uVar18 = 0;
  }
  else {
    iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    _alignment = (TextureFormat)((ulong)_alignment & 0xffffffff00000000);
    (**(code **)(CONCAT44(extraout_var,iVar8) + 0x868))(0x919f,&alignment);
    dVar6 = (**(code **)(CONCAT44(extraout_var,iVar8) + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x407);
    uVar18 = (long)alignment * this->m_offset;
  }
  testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
  context = this->m_renderCtx;
  dVar6 = this->m_format;
  sVar19 = this->m_bufferSize;
  sVar25 = this->m_size;
  renderBits = this->m_preRender;
  program = this->m_preRenderProgram;
  MVar1 = this->m_modify;
  renderBits_00 = this->m_postRender;
  program_00 = this->m_postRenderProgram;
  iVar9 = (*context->_vptr_RenderContext[4])(context);
  iVar8 = *(int *)CONCAT44(extraout_var_00,iVar9);
  iVar9 = ((int *)CONCAT44(extraout_var_00,iVar9))[1];
  iVar10 = (*context->_vptr_RenderContext[3])(context);
  lVar20 = CONCAT44(extraout_var_01,iVar10);
  iVar10 = 0x100;
  if (iVar8 < 0x100) {
    iVar10 = iVar8;
  }
  height = 0x100;
  if (iVar9 < 0x100) {
    height = iVar9;
  }
  local_2a8.m_data[0] = 0.25;
  local_2a8.m_data[1] = 0.5;
  local_2a8.m_data[2] = 0.75;
  local_2a8.m_data[3] = 1.0;
  log = (TextureFormat)testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&alignment,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&info)
  ;
  tcu::ResultCollector::ResultCollector(&resultCollector,(TestLog *)log,(string *)&alignment);
  std::__cxx11::string::~string((string *)&alignment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&alignment,"Implementation Values",(allocator<char> *)&maxTextureSize);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info,"Implementation Values",(allocator<char> *)&data_3);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,(TestLog *)log,(string *)&alignment,(string *)&info);
  std::__cxx11::string::~string((string *)&info);
  std::__cxx11::string::~string((string *)&alignment);
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       glu::ContextInfo::create(context);
  iVar11 = (*context->_vptr_RenderContext[3])(context);
  lVar14 = CONCAT44(extraout_var_02,iVar11);
  CVar12.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])(context);
  bVar4 = glu::contextSupports(CVar12,(ApiType)0x133);
  if (bVar4) {
    _maxTextureSize = _maxTextureSize & 0xffffffff00000000;
    (**(code **)(lVar14 + 0x868))(0x8c2b);
    dVar13 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar13,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x325);
    _alignment = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
    std::operator<<((ostream *)app_Stack_210,"GL_MAX_TEXTURE_BUFFER_SIZE : ");
    std::ostream::operator<<((ostringstream *)app_Stack_210,maxTextureSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0151b630:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
  }
  else {
    CVar12.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])(context);
    bVar4 = glu::contextSupports(CVar12,(ApiType)0x13);
    if ((bVar4) &&
       (bVar4 = glu::ContextInfo::isExtensionSupported
                          (info.
                           super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                           .m_data.ptr,"GL_EXT_texture_buffer"), bVar4)) {
      _maxTextureSize = _maxTextureSize & 0xffffffff00000000;
      (**(code **)(lVar14 + 0x868))(0x8c2b);
      dVar13 = (**(code **)(lVar14 + 0x800))();
      glu::checkError(dVar13,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x32f);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"GL_MAX_TEXTURE_BUFFER_SIZE_EXT : ");
      std::ostream::operator<<((ostringstream *)app_Stack_210,maxTextureSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      _maxTextureSize = _maxTextureSize & 0xffffffff00000000;
      (**(code **)(lVar14 + 0x868))(0x919f);
      dVar13 = (**(code **)(lVar14 + 0x800))();
      glu::checkError(dVar13,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x338);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT : ");
      std::ostream::operator<<((ostringstream *)app_Stack_210,maxTextureSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_0151b630;
    }
  }
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&alignment,"Texture Info",(allocator<char> *)&maxTextureSize);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info,"Texture Info",(allocator<char> *)&data_3);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,(TestLog *)log,(string *)&alignment,(string *)&info);
  std::__cxx11::string::~string((string *)&info);
  std::__cxx11::string::~string((string *)&alignment);
  _alignment = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
  std::operator<<((ostream *)app_Stack_210,"Texture format : ");
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       (ContextInfo *)glu::getTextureFormatName;
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_4_ =
       dVar6;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&info,(ostream *)app_Stack_210);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
  _alignment = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
  std::operator<<((ostream *)app_Stack_210,"Buffer size : ");
  std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
  if (sVar25 != 0 || uVar18 != 0) {
    _alignment = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
    std::operator<<((ostream *)app_Stack_210,"Buffer range offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
    _alignment = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
    std::operator<<((ostream *)app_Stack_210,"Buffer range size: ");
    std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::Surface::Surface(&referenceTarget,iVar10,height);
  bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.x = rng.m_rnd.x;
  local_48.y = rng.m_rnd.y;
  local_48.z = rng.m_rnd.z;
  local_48.w = rng.m_rnd.w;
  anon_unknown_1::genRandomCoords((Random *)&local_48,&bufferData,0,sVar19);
  uVar17 = 0;
  for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
    if (uVar17 < sVar25 + uVar18 && uVar18 <= uVar17) {
      uVar23 = 'U';
      uVar22 = uVar23;
      if (uVar21 < 2) {
        uVar22 = 0xaa;
      }
      bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 * 2] = uVar22;
      if ((uVar21 & 1) == 0) {
        uVar23 = 0xaa;
      }
      bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 * 2 + 1] = uVar23;
    }
    uVar17 = uVar17 + 0x55;
  }
  glu::TextureBuffer::TextureBuffer
            ((TextureBuffer *)&section,context,dVar6,sVar19,uVar18,sVar25,
             bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (iVar9 < 0x40 && iVar8 < 0x40) {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"Too small viewport",
               "width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x381);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar20 + 0x1a00))(0,0,iVar10,height);
  (**(code **)(lVar20 + 0x1c0))
            (local_2a8.m_data[0],local_2a8.m_data[1],local_2a8.m_data[2],local_2a8.m_data[3]);
  (**(code **)(lVar20 + 0x188))(0x4000);
  dVar6 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar6,"Screen setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x389);
  tcu::Surface::getAccess((PixelBufferAccess *)&alignment,&referenceTarget);
  tcu::clear((PixelBufferAccess *)&alignment,&local_2a8);
  glu::TextureBuffer::upload((TextureBuffer *)&section);
  if (renderBits != RENDERBITS_NONE) {
    tcu::Surface::getAccess((PixelBufferAccess *)&alignment,&referenceTarget);
    anon_unknown_1::render
              ((TestLog *)log,context,renderBits,&rng,program,(TextureBuffer *)&section,
               (PixelBufferAccess *)&alignment);
  }
  if (MVar1 != MODIFYBITS_NONE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alignment,"Modifying Texture buffer",(allocator<char> *)&maxTextureSize);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&info,"Modifying Texture Buffer",(allocator<char> *)&data_3);
    tcu::ScopedLogSection::ScopedLogSection
              (&modifySection,(TestLog *)log,(string *)&alignment,(string *)&info);
    std::__cxx11::string::~string((string *)&info);
    std::__cxx11::string::~string((string *)&alignment);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alignment,"Modify Operations",(allocator<char> *)&data_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&info,"Modify Operations",(allocator<char> *)&local_228);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&maxTextureSize,(TestLog *)log,(string *)&alignment,
               (string *)&info);
    std::__cxx11::string::~string((string *)&info);
    std::__cxx11::string::~string((string *)&alignment);
    info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
         (ContextInfo *)&DAT_00000001;
    info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
         anon_var_dwarf_2d45b32;
    for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 0x10) {
      if ((*(ModifyBits *)
            ((long)&info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                    m_data.ptr + lVar20) & MVar1) != MODIFYBITS_NONE) {
        _alignment = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
        this_00 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&alignment,
                             (char **)(&info.
                                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                                        .m_data.field_0x8 + lVar20));
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&maxTextureSize);
    if ((MVar1 & MODIFYBITS_BUFFERDATA) != MODIFYBITS_NONE) {
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
           (ContextInfo *)0x0;
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
           0;
      _maxTextureSize = (pointer)rng.m_rnd._0_8_;
      sStack_2f0._0_4_ = rng.m_rnd.z;
      sStack_2f0._4_4_ = rng.m_rnd.w;
      anon_unknown_1::genRandomCoords
                ((Random *)&maxTextureSize,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&info,0,local_320._8_8_);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"BufferData, Size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
                ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)&alignment,
                 (uchar *)info.
                          super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                          m_data.ptr,
                 info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ -
                 (long)info.
                       super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                       m_data.ptr);
      TVar2 = _alignment;
      _alignment = (TextureFormat)local_320._M_allocated_capacity;
      TVar3 = _alignment;
      alignment = TVar2.order;
      CStack_214 = TVar2.type;
      local_320._M_allocated_capacity._0_4_ = alignment;
      local_320._M_allocated_capacity._4_4_ = CStack_214;
      local_320._8_8_ = app_Stack_210[0];
      _alignment = TVar3;
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear
                ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)&alignment);
      glu::TextureBuffer::upload((TextureBuffer *)&section);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&info);
    }
    sVar19 = 0x40;
    if ((MVar1 & MODIFYBITS_BUFFERSUBDATA) != MODIFYBITS_NONE) {
      iVar8 = (*context->_vptr_RenderContext[3])(context);
      lVar20 = CONCAT44(extraout_var_03,iVar8);
      fVar27 = deRandom_getFloat(&rng.m_rnd);
      uVar26 = local_320._8_8_;
      if (local_308 != (_func_int **)0x0) {
        uVar26 = local_308;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar26;
      uVar18 = (ulong)fVar27;
      uVar18 = (long)(fVar27 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18;
      if (uVar18 < 0x41) {
        uVar18 = sVar19;
      }
      dVar6 = deRandom_getUint32(&rng.m_rnd);
      sVar25 = (ulong)dVar6 % ((local_320._8_8_ - local_310) - uVar18) + local_310;
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
           (ContextInfo *)0x0;
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
           0;
      _maxTextureSize = (pointer)rng.m_rnd._0_8_;
      sStack_2f0._0_4_ = rng.m_rnd.z;
      sStack_2f0._4_4_ = rng.m_rnd.w;
      anon_unknown_1::genRandomCoords
                ((Random *)&maxTextureSize,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&info,sVar25,uVar18);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"BufferSubData, Offset: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,", Size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      (**(code **)(lVar20 + 0x40))(0x8c2a,local_2fc);
      (**(code **)(lVar20 + 0x168))
                (0x8c2a,(long)(int)sVar25,
                 (long)(info.
                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                        m_data._8_4_ -
                       (int)info.
                            super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                            .m_data.ptr));
      (**(code **)(lVar20 + 0x40))(0x8c2a,0);
      dVar6 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar6,"Failed to update data with glBufferSubData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1cb);
      memcpy((void *)(sVar25 + local_320._M_allocated_capacity),
             info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.
             ptr,(long)(info.
                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                        m_data._8_4_ -
                       (int)info.
                            super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                            .m_data.ptr));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&info);
    }
    if ((MVar1 & MODIFYBITS_MAPBUFFER_WRITE) != MODIFYBITS_NONE) {
      iVar8 = (*context->_vptr_RenderContext[3])(context);
      lVar20 = CONCAT44(extraout_var_04,iVar8);
      fVar27 = deRandom_getFloat(&rng.m_rnd);
      uVar26 = local_320._8_8_;
      if (local_308 != (_func_int **)0x0) {
        uVar26 = local_308;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar26;
      uVar18 = (ulong)fVar27;
      uVar18 = (long)(fVar27 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18;
      if (uVar18 < 0x41) {
        uVar18 = sVar19;
      }
      dVar6 = deRandom_getUint32(&rng.m_rnd);
      sVar25 = (ulong)dVar6 % ((local_320._8_8_ - local_310) - uVar18) + local_310;
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
           (ContextInfo *)0x0;
      info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
           0;
      _maxTextureSize = (pointer)rng.m_rnd._0_8_;
      sStack_2f0._0_4_ = rng.m_rnd.z;
      sStack_2f0._4_4_ = rng.m_rnd.w;
      anon_unknown_1::genRandomCoords
                ((Random *)&maxTextureSize,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&info,sVar25,uVar18);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"glMapBufferRange, Write Only, Offset: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,", Size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      (**(code **)(lVar20 + 0x40))(0x8c2a,local_2fc);
      lVar14 = (**(code **)(lVar20 + 0xd00))(0x8c2a,(long)(int)sVar25,(long)(int)uVar18,2);
      dVar6 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar6,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1e3);
      if (lVar14 == 0) {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,(char *)0x0,"ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x1e4);
LAB_0151c8ae:
        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      for (lVar15 = 0;
          lVar15 < info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                   m_data._8_4_ -
                   (int)info.
                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                        m_data.ptr; lVar15 = lVar15 + 1) {
        *(undefined1 *)(lVar14 + lVar15) =
             *(undefined1 *)
              ((long)&(info.
                       super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                       m_data.ptr)->_vptr_ContextInfo + lVar15);
      }
      cVar5 = (**(code **)(lVar20 + 0x1670))(0x8c2a);
      if (cVar5 == '\0') {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x1e9);
        goto LAB_0151c8ae;
      }
      (**(code **)(lVar20 + 0x40))(0x8c2a,0);
      dVar6 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar6,"Failed to update data with glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1ec);
      memcpy((void *)(sVar25 + local_320._M_allocated_capacity),
             info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.
             ptr,(long)(info.
                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                        m_data._8_4_ -
                       (int)info.
                            super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                            .m_data.ptr));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&info);
    }
    if ((MVar1 & MODIFYBITS_MAPBUFFER_READWRITE) != MODIFYBITS_NONE) {
      iVar8 = (*context->_vptr_RenderContext[3])(context);
      lVar20 = CONCAT44(extraout_var_05,iVar8);
      fVar27 = deRandom_getFloat(&rng.m_rnd);
      uVar26 = local_320._8_8_;
      if (local_308 != (_func_int **)0x0) {
        uVar26 = local_308;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar26;
      uVar18 = (ulong)fVar27;
      uVar18 = (long)(fVar27 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18;
      if (0x40 < uVar18) {
        sVar19 = uVar18;
      }
      dVar6 = deRandom_getUint32(&rng.m_rnd);
      sVar25 = (ulong)dVar6 % ((local_320._8_8_ - local_310) - sVar19) + local_310;
      lVar15 = local_320._M_allocated_capacity + sVar25;
      data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.x = rng.m_rnd.x;
      local_228.y = rng.m_rnd.y;
      local_228.z = rng.m_rnd.z;
      local_228.w = rng.m_rnd.w;
      anon_unknown_1::genRandomCoords((Random *)&local_228,&data_3,sVar25,sVar19);
      _alignment = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,"glMapBufferRange, Read Write, Offset: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      std::operator<<((ostream *)app_Stack_210,", Size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
      (**(code **)(lVar20 + 0x40))(0x8c2a,local_2fc);
      lVar14 = (**(code **)(lVar20 + 0xd00))(0x8c2a,(long)(int)sVar25,(long)(int)sVar19,3);
      dVar6 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar6,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x207);
      if (lVar14 == 0) {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,(char *)0x0,"ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x208);
LAB_0151c918:
        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar18 = 0;
      for (lVar24 = 0;
          lVar24 < (int)data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                   (int)data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start; lVar24 = lVar24 + 1) {
        if (*(char *)(lVar14 + lVar24) != *(char *)(lVar15 + lVar24)) {
          if (uVar18 < 0x18) {
            _alignment = log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
            std::operator<<((ostream *)app_Stack_210,"Invalid byte in mapped buffer. ");
            local_230 = (ulong)data_3.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar24];
            tcu::Format::Hex<2ul>::toString_abi_cxx11_((string *)&info,&local_230);
            std::operator<<((ostream *)app_Stack_210,(string *)&info);
            std::operator<<((ostream *)app_Stack_210," at ");
            std::ostream::operator<<((ostringstream *)app_Stack_210,(int)lVar24);
            std::operator<<((ostream *)app_Stack_210,", expected ");
            local_238 = (ulong)*(byte *)(lVar15 + lVar24);
            tcu::Format::Hex<2ul>::toString_abi_cxx11_((string *)&maxTextureSize,&local_238);
            std::operator<<((ostream *)app_Stack_210,(string *)&maxTextureSize);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&maxTextureSize);
            std::__cxx11::string::~string((string *)&info);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
          }
          uVar18 = uVar18 + 1;
        }
        *(uchar *)(lVar14 + lVar24) =
             data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar24];
      }
      cVar5 = (**(code **)(lVar20 + 0x1670))(0x8c2a);
      if (cVar5 == '\0') {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x217);
        goto LAB_0151c918;
      }
      if (uVar18 != 0) {
        _alignment = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_210);
        std::operator<<((ostream *)app_Stack_210,"Total of ");
        std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_210);
        std::operator<<((ostream *)app_Stack_210," invalid bytes.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&alignment,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_210);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&alignment,"Invalid data in mapped buffer",(allocator<char> *)&info);
        tcu::ResultCollector::fail(&resultCollector,(string *)&alignment);
        std::__cxx11::string::~string((string *)&alignment);
      }
      (**(code **)(lVar20 + 0x40))(0x8c2a,0);
      dVar6 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar6,"Failed to update data with glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x221);
      lVar20 = (long)((int)data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (int)data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      lVar14 = 0;
      if (lVar20 < 1) {
        lVar20 = lVar14;
      }
      for (; lVar20 != lVar14; lVar14 = lVar14 + 1) {
        *(uchar *)(lVar15 + lVar14) =
             data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar14];
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&modifySection);
  }
  if (renderBits_00 != RENDERBITS_NONE) {
    tcu::Surface::getAccess((PixelBufferAccess *)&alignment,&referenceTarget);
    anon_unknown_1::render
              ((TestLog *)log,context,renderBits_00,&rng,program_00,(TextureBuffer *)&section,
               (PixelBufferAccess *)&alignment);
  }
  glu::TextureBuffer::~TextureBuffer((TextureBuffer *)&section);
  tcu::Surface::getAccess((PixelBufferAccess *)&info,&referenceTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&alignment,"Verify screen contents",(allocator<char> *)&data_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"Verify screen contents",(allocator<char> *)&local_228);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&maxTextureSize,(TestLog *)log,(string *)&alignment,
             (string *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&alignment);
  tcu::Surface::Surface
            ((Surface *)&section,
             info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.
             _8_4_,info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                   m_data._12_4_);
  tcu::Surface::getAccess((PixelBufferAccess *)&alignment,(Surface *)&section);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&alignment);
  tcu::Surface::getAccess((PixelBufferAccess *)&alignment,(Surface *)&section);
  bVar4 = tcu::fuzzyCompare((TestLog *)log,"Result of rendering","Result of rendering",
                            (ConstPixelBufferAccess *)&info,(ConstPixelBufferAccess *)&alignment,
                            0.05,COMPARE_LOG_RESULT);
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alignment,"Rendering failed",(allocator<char> *)&data_3);
    tcu::ResultCollector::fail(&resultCollector,(string *)&alignment);
    std::__cxx11::string::~string((string *)&alignment);
  }
  tcu::Surface::~Surface((Surface *)&section);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&maxTextureSize);
  tcu::ResultCollector::setTestContextResult(&resultCollector,testCtx);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bufferData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  tcu::Surface::~Surface(&referenceTarget);
  tcu::ResultCollector::~ResultCollector(&resultCollector);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureBufferCase::iterate (void)
{
	de::Random	rng		(deInt32Hash(deStringHash(getName())));
	size_t		offset;

	if (m_offset != 0)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deInt32					alignment	= 0;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)");

		offset = m_offset * alignment;
	}
	else
		offset = 0;

	runTests(m_testCtx, m_renderCtx, rng, m_format, m_bufferSize, offset, m_size, m_preRender, m_preRenderProgram, m_modify, m_postRender, m_postRenderProgram);

	return STOP;
}